

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O2

void __thiscall
Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker
          (NonRecursiveReductionRunner *this,CSTMarker *marker,
          vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
          vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
          *tags)

{
  pointer *ppCVar1;
  ulong uVar2;
  pointer puVar3;
  atomic<int> *paVar4;
  uint __line;
  pointer pSVar5;
  semantic_value_type val;
  ulong uVar6;
  char *__assertion;
  SymbolEntry sym;
  
  uVar6 = marker->m_value;
  uVar2 = (starts->super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>).
          _M_impl.super__Vector_impl_data._M_finish[-1].m_value;
  if (((uVar2 ^ uVar6) & 0x7fff000000000000) == 0) {
    sym.start = uVar2 & 0xffffffffffff;
    sym.end = uVar6 & 0xffffffffffff;
    sym.id = uVar6 >> 0x30 & 0x7fff;
    pSVar5 = (tags->
             super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (ulong)(uint)pSVar5[-1];
    if (pSVar5[-1] < VALUE) {
      uVar6 = 0;
    }
    else {
      pSVar5 = pSVar5 + -1;
      (tags->
      super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
      )._M_impl.super__Vector_impl_data._M_finish = pSVar5;
    }
    if (((tags->
         super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
         )._M_impl.super__Vector_impl_data._M_start == pSVar5) || (pSVar5[-1] < VALUE)) {
      puVar3 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      val = (*this->m_listener)(&sym,puVar3 + (((ulong)((long)(values->
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar3) >> 3) - uVar6),(int)uVar6,
                                this->m_listener_context);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (values,((long)(values->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(values->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3) - uVar6);
      paVar4 = this->reduction_counter;
      if (paVar4 != (atomic<int> *)0x0) {
        LOCK();
        *(int *)paVar4 = *(int *)paVar4 + 1;
        UNLOCK();
      }
      pSVar5 = (tags->
               super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar5[-1] == START_MARKER) {
        (tags->
        super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
        )._M_impl.super__Vector_impl_data._M_finish = pSVar5 + -1;
        ppCVar1 = &(starts->
                   super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + -1;
        push_value(val,values,tags);
        return;
      }
      __assertion = "tags.back() == detail::StackEntryTag::START_MARKER";
      __line = 0x5a;
    }
    else {
      __assertion = "tags.empty() || !detail::isValueTag(tags.back())";
      __line = 0x4f;
    }
  }
  else {
    __assertion = "marker.get_machine_id() == starts.back().get_machine_id()";
    __line = 0x47;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                ,__line,
                "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
               );
}

Assistant:

void reduce_by_end_marker(const CSTMarker& marker, std::vector<CSTMarker>& starts, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    assert(marker.get_machine_id() == starts.back().get_machine_id());
    SymbolEntry sym(marker.get_machine_id(), starts.back().get_offset(), marker.get_offset());
    int value_count = static_cast<int>(tags.back());
    if (value_count < 1) {
      value_count = 0;
    } else {
      tags.pop_back();
    }
    assert(tags.empty() || !detail::isValueTag(tags.back()));
#if PYCENTAURUS
    auto new_val = m_listener(&sym, values.data(), value_count, m_listener_context);
#else
    auto new_val = m_listener(&sym, &values[values.size() - value_count], value_count, m_listener_context);
    values.resize(values.size() - value_count);
#endif
    if (reduction_counter != nullptr) {
      (*reduction_counter)++;
    }

    assert(tags.back() == detail::StackEntryTag::START_MARKER);
    tags.pop_back();
    starts.pop_back();
    push_value(new_val, values, tags);
#if PYCENTAURUS
    values.front() = 0;
#endif
  }